

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3EvalPhraseStart(Fts3Cursor *pCsr,int bOptOk,Fts3Phrase *p)

{
  uint uVar1;
  int nTerm;
  Fts3Table *p_00;
  long lVar2;
  Fts3MultiSegReader *pCsr_00;
  char *zTerm;
  uint uVar3;
  byte bVar4;
  _func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *xCmp;
  ulong uVar5;
  int iVar6;
  byte bVar7;
  Fts3PhraseToken *pFVar8;
  ulong uVar9;
  code *pcVar10;
  long lVar11;
  int iVar12;
  bool bVar13;
  Fts3Table *pTab;
  int nThis;
  int local_74;
  Fts3PhraseToken *local_70;
  long local_68;
  int local_60;
  int local_5c;
  char *local_58;
  _func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *local_50;
  ulong local_48;
  Fts3SegReader **local_40;
  char *local_38;
  
  p_00 = (Fts3Table *)(pCsr->base).pVtab;
  if (((bOptOk == 0) || (pCsr->bDesc != p_00->bDescIdx)) || (p->nToken - 5U < 0xfffffffc)) {
LAB_001d3d0b:
    if (0 < p->nToken) {
      pFVar8 = p->aToken;
      lVar11 = 0;
      iVar12 = 0;
      do {
        iVar6 = 0;
        if (pFVar8->pSegcsr != (Fts3MultiSegReader *)0x0) {
          local_74 = 0;
          local_58 = (char *)0x0;
          iVar6 = fts3TermSelect(p_00,pFVar8,p->iColumn,&local_74,&local_58);
          if (iVar6 == 0) {
            iVar6 = fts3EvalPhraseMergeToken(p_00,p,(int)lVar11,local_58,local_74);
          }
        }
        if (iVar6 != 0) break;
        lVar11 = lVar11 + 1;
        pFVar8 = pFVar8 + 1;
      } while (lVar11 < p->nToken);
      goto LAB_001d3d91;
    }
    iVar6 = 0;
  }
  else {
    uVar1 = p->nToken;
    bVar4 = 0;
    uVar3 = uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = 0;
    }
    if ((int)uVar1 < 1) goto LAB_001d3d0b;
    lVar11 = 0;
    do {
      if (*(int *)((long)&p->aToken[0].bFirst + lVar11) == 0) {
        lVar2 = *(long *)((long)&p->aToken[0].pSegcsr + lVar11);
        bVar7 = 1;
        if ((lVar2 != 0) && (*(int *)(lVar2 + 0x30) == 0)) goto LAB_001d3b5e;
        bVar13 = false;
      }
      else {
LAB_001d3b5e:
        bVar13 = true;
        bVar7 = 0;
      }
      if (*(long *)((long)&p->aToken[0].pSegcsr + lVar11) != 0) {
        bVar4 = 1;
      }
    } while ((!bVar13) &&
            (bVar13 = (ulong)uVar3 * 0x28 + -0x28 != lVar11, lVar11 = lVar11 + 0x28, bVar13));
    if (!(bool)(bVar7 & bVar4)) goto LAB_001d3d0b;
    local_60 = -1;
    if (p->iColumn < p_00->nColumn) {
      local_60 = p->iColumn;
    }
    iVar12 = 1;
    iVar6 = 1;
    if (0 < p->nToken) {
      pFVar8 = p->aToken;
      local_68 = 0;
      local_70 = pFVar8;
      do {
        pCsr_00 = pFVar8[local_68].pSegcsr;
        iVar6 = 0;
        if (pCsr_00 != (Fts3MultiSegReader *)0x0) {
          zTerm = pFVar8[local_68].z;
          nTerm = pFVar8[local_68].n;
          local_48 = (ulong)(uint)pCsr_00->nSegment;
          pcVar10 = fts3SegReaderDoclistCmpRev;
          if (p_00->bDescIdx == '\0') {
            pcVar10 = fts3SegReaderDoclistCmp;
          }
          iVar6 = fts3SegReaderStart(p_00,pCsr_00,zTerm,nTerm);
          uVar5 = local_48;
          pFVar8 = local_70;
          if (iVar6 == 0) {
            lVar11 = 0;
            uVar9 = 0;
            local_5c = nTerm;
            local_50 = pcVar10;
            local_38 = zTerm;
            if (0 < (int)local_48) {
              local_40 = pCsr_00->apSegment;
              uVar9 = 0;
              do {
                if ((local_40[uVar9]->aNode == (char *)0x0) ||
                   (iVar6 = fts3SegReaderTermCmp(local_40[uVar9],local_38,local_5c), iVar6 != 0))
                goto LAB_001d3c97;
                uVar9 = uVar9 + 1;
              } while (uVar5 != uVar9);
              uVar9 = uVar5 & 0xffffffff;
            }
LAB_001d3c97:
            xCmp = local_50;
            pCsr_00->nAdvance = (int)uVar9;
            if (0 < (int)uVar9) {
              lVar11 = 0;
              do {
                iVar6 = fts3SegReaderFirstDocid(p_00,pCsr_00->apSegment[lVar11]);
                pFVar8 = local_70;
                if (iVar6 != 0) goto LAB_001d3cee;
                lVar11 = lVar11 + 1;
              } while (lVar11 < pCsr_00->nAdvance);
            }
            fts3SegReaderSort(pCsr_00->apSegment,(int)lVar11,(int)lVar11,xCmp);
            pCsr_00->iColFilter = local_60;
            iVar6 = 0;
            pFVar8 = local_70;
          }
        }
LAB_001d3cee:
      } while ((iVar6 == 0) && (local_68 = local_68 + 1, local_68 < p->nToken));
      goto LAB_001d3d91;
    }
  }
  iVar12 = iVar6;
  iVar6 = 0;
LAB_001d3d91:
  p->bIncr = iVar12;
  return iVar6;
}

Assistant:

static int fts3EvalPhraseStart(Fts3Cursor *pCsr, int bOptOk, Fts3Phrase *p){
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  int rc = SQLITE_OK;             /* Error code */
  int i;

  /* Determine if doclists may be loaded from disk incrementally. This is
  ** possible if the bOptOk argument is true, the FTS doclists will be
  ** scanned in forward order, and the phrase consists of 
  ** MAX_INCR_PHRASE_TOKENS or fewer tokens, none of which are are "^first"
  ** tokens or prefix tokens that cannot use a prefix-index.  */
  int bHaveIncr = 0;
  int bIncrOk = (bOptOk 
   && pCsr->bDesc==pTab->bDescIdx 
   && p->nToken<=MAX_INCR_PHRASE_TOKENS && p->nToken>0
#ifdef SQLITE_TEST
   && pTab->bNoIncrDoclist==0
#endif
  );
  for(i=0; bIncrOk==1 && i<p->nToken; i++){
    Fts3PhraseToken *pToken = &p->aToken[i];
    if( pToken->bFirst || (pToken->pSegcsr!=0 && !pToken->pSegcsr->bLookup) ){
      bIncrOk = 0;
    }
    if( pToken->pSegcsr ) bHaveIncr = 1;
  }

  if( bIncrOk && bHaveIncr ){
    /* Use the incremental approach. */
    int iCol = (p->iColumn >= pTab->nColumn ? -1 : p->iColumn);
    for(i=0; rc==SQLITE_OK && i<p->nToken; i++){
      Fts3PhraseToken *pToken = &p->aToken[i];
      Fts3MultiSegReader *pSegcsr = pToken->pSegcsr;
      if( pSegcsr ){
        rc = sqlite3Fts3MsrIncrStart(pTab, pSegcsr, iCol, pToken->z, pToken->n);
      }
    }
    p->bIncr = 1;
  }else{
    /* Load the full doclist for the phrase into memory. */
    rc = fts3EvalPhraseLoad(pCsr, p);
    p->bIncr = 0;
  }

  assert( rc!=SQLITE_OK || p->nToken<1 || p->aToken[0].pSegcsr==0 || p->bIncr );
  return rc;
}